

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLookupResultValid
               (TextureCubeView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  ConstPixelBufferAccess **ppCVar1;
  int *piVar2;
  float __x;
  CubeFace face;
  ConstPixelBufferAccess *pCVar3;
  TextureFormat TVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ConstPixelBufferAccess **ppCVar11;
  bool bVar12;
  FilterMode FVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int numPossibleFaces;
  LookupPrecision *local_2c0;
  CubeFaceFloatCoords faceCoords;
  Vec2 local_290;
  undefined1 local_288 [16];
  Vec3 *local_278;
  long local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  ConstPixelBufferAccess faces [6];
  CubeFace possibleFaces [6];
  ConstPixelBufferAccess faces1 [6];
  
  numPossibleFaces = 0;
  local_2c0 = prec;
  local_278 = coord;
  TexVerifierUtil::getPossibleCubeFaces(coord,&prec->coordBits,possibleFaces,&numPossibleFaces);
  if (numPossibleFaces == 0) {
    bVar12 = true;
  }
  else {
    bVar12 = 0 < numPossibleFaces;
    if (0 < numPossibleFaces) {
      ppCVar1 = texture->m_levels;
      local_270 = 0;
      do {
        face = possibleFaces[local_270];
        projectToFace((tcu *)faces,face,local_278);
        faceCoords.s = (float)faces[0].m_format.order;
        faceCoords.t = (float)faces[0].m_format.type;
        fVar18 = lodBounds->m_data[0];
        __x = lodBounds->m_data[1];
        fVar17 = sampler->lodThreshold;
        faceCoords.face = face;
        if (fVar18 <= fVar17) {
          local_288._0_4_ = fVar17;
          lVar14 = 0;
          do {
            ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar14 + -8));
            lVar14 = lVar14 + 0x28;
          } while (lVar14 != 0xf0);
          lVar14 = 0;
          ppCVar11 = ppCVar1;
          do {
            pCVar3 = *ppCVar11;
            *(void **)((long)(&faces[0].m_pitch + 1) + lVar14 * 8) = pCVar3->m_data;
            TVar4 = pCVar3->m_format;
            uVar5 = *(undefined8 *)(pCVar3->m_size).m_data;
            uVar6 = *(undefined8 *)((pCVar3->m_pitch).m_data + 1);
            *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + -1) =
                 *(undefined8 *)((pCVar3->m_size).m_data + 2);
            *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar6;
            *(TextureFormat *)(faces[0].m_size.m_data + lVar14 * 2 + -2) = TVar4;
            *(undefined8 *)(faces[0].m_size.m_data + lVar14 * 2) = uVar5;
            lVar14 = lVar14 + 5;
            ppCVar11 = ppCVar11 + 1;
          } while (lVar14 != 0x1e);
          bVar7 = isCubeLevelSampleResultValid
                            (&faces,sampler,sampler->magFilter,local_2c0,&faceCoords,result);
          fVar17 = (float)local_288._0_4_;
          if (bVar7) {
            return bVar12;
          }
        }
        if (fVar17 < __x) {
          FVar13 = sampler->minFilter;
          iVar16 = texture->m_numLevels;
          iVar15 = iVar16 + -1;
          if (iVar15 < 1 || (FVar13 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
            if ((FVar13 == LINEAR_MIPMAP_NEAREST) || (FVar13 == NEAREST_MIPMAP_NEAREST)) {
              fVar18 = ceilf(fVar18 + 0.5);
              iVar9 = (int)fVar18 + -1;
              iVar16 = iVar15;
              if (iVar9 < iVar15) {
                iVar16 = iVar9;
              }
              bVar7 = false;
              if (iVar9 < 0) {
                iVar16 = 0;
              }
              fVar18 = floorf(__x + 0.5);
              iVar9 = (int)fVar18;
              if (iVar9 < iVar15) {
                iVar15 = iVar9;
              }
              if (iVar9 < 0) {
                iVar15 = 0;
              }
              bVar8 = iVar15 < iVar16;
              if (iVar16 <= iVar15) {
                do {
                  lVar14 = 0;
                  do {
                    ConstPixelBufferAccess::ConstPixelBufferAccess
                              ((ConstPixelBufferAccess *)
                               ((long)faces[0].m_size.m_data + lVar14 + -8));
                    lVar14 = lVar14 + 0x28;
                  } while (lVar14 != 0xf0);
                  lVar14 = 0;
                  ppCVar11 = ppCVar1;
                  do {
                    pCVar3 = *ppCVar11;
                    *(void **)((long)(&faces[0].m_pitch + 1) + lVar14 * 8) = pCVar3[iVar16].m_data;
                    TVar4 = pCVar3[iVar16].m_format;
                    uVar5 = *(undefined8 *)pCVar3[iVar16].m_size.m_data;
                    piVar2 = pCVar3[iVar16].m_size.m_data + 2;
                    uVar6 = *(undefined8 *)(piVar2 + 2);
                    *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + -1) =
                         *(undefined8 *)piVar2;
                    *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar6;
                    *(TextureFormat *)(faces[0].m_size.m_data + lVar14 * 2 + -2) = TVar4;
                    *(undefined8 *)(faces[0].m_size.m_data + lVar14 * 2) = uVar5;
                    lVar14 = lVar14 + 5;
                    ppCVar11 = ppCVar11 + 1;
                  } while (lVar14 != 0x1e);
                  uVar10 = sampler->minFilter - LINEAR;
                  FVar13 = NEAREST;
                  if (uVar10 < 5) {
                    FVar13 = *(FilterMode *)(&DAT_01d17018 + (ulong)uVar10 * 4);
                  }
                  bVar7 = isCubeLevelSampleResultValid
                                    (&faces,sampler,FVar13,local_2c0,&faceCoords,result);
                  if (bVar7) {
                    bVar7 = true;
                    goto LAB_019fdb83;
                  }
                  iVar16 = iVar16 + 1;
                  bVar8 = iVar15 < iVar16;
                } while (iVar16 <= iVar15);
                bVar7 = false;
              }
LAB_019fdb83:
              if (bVar8) goto LAB_019fdac6;
            }
            else {
              lVar14 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar14 + -8));
                lVar14 = lVar14 + 0x28;
              } while (lVar14 != 0xf0);
              lVar14 = 0;
              ppCVar11 = ppCVar1;
              do {
                pCVar3 = *ppCVar11;
                *(void **)((long)(&faces[0].m_pitch + 1) + lVar14 * 8) = pCVar3->m_data;
                TVar4 = pCVar3->m_format;
                uVar5 = *(undefined8 *)(pCVar3->m_size).m_data;
                uVar6 = *(undefined8 *)((pCVar3->m_pitch).m_data + 1);
                *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + -1) =
                     *(undefined8 *)((pCVar3->m_size).m_data + 2);
                *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar6;
                *(TextureFormat *)(faces[0].m_size.m_data + lVar14 * 2 + -2) = TVar4;
                *(undefined8 *)(faces[0].m_size.m_data + lVar14 * 2) = uVar5;
                lVar14 = lVar14 + 5;
                ppCVar11 = ppCVar11 + 1;
              } while (lVar14 != 0x1e);
              bVar8 = isCubeLevelSampleResultValid
                                (&faces,sampler,sampler->minFilter,local_2c0,&faceCoords,result);
              bVar7 = true;
              if (!bVar8) {
LAB_019fdac6:
                bVar7 = false;
              }
            }
          }
          else {
            fVar17 = floorf(fVar18);
            iVar9 = (int)fVar17;
            iVar16 = iVar16 + -2;
            iVar15 = iVar16;
            if (iVar9 < iVar16) {
              iVar15 = iVar9;
            }
            if (iVar9 < 0) {
              iVar15 = 0;
            }
            fVar17 = floorf(__x);
            iVar9 = (int)fVar17;
            if (iVar9 < iVar16) {
              iVar16 = iVar9;
            }
            if (iVar9 < 0) {
              iVar16 = 0;
            }
            do {
              iVar9 = iVar15;
              if (iVar16 < iVar9) {
                bVar7 = false;
                goto LAB_019fdabc;
              }
              fVar19 = fVar18 - (float)iVar9;
              local_288 = ZEXT416((uint)fVar19);
              fVar17 = 1.0;
              if (fVar19 <= 1.0) {
                fVar17 = fVar19;
              }
              local_268 = ZEXT416((uint)fVar17);
              fVar19 = __x - (float)iVar9;
              local_248 = ZEXT416((uint)fVar19);
              fVar17 = 1.0;
              if (fVar19 <= 1.0) {
                fVar17 = fVar19;
              }
              local_258 = ZEXT416((uint)fVar17);
              lVar14 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar14 + -8));
                lVar14 = lVar14 + 0x28;
              } while (lVar14 != 0xf0);
              lVar14 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces1[0].m_size.m_data + lVar14 + -8));
                lVar14 = lVar14 + 0x28;
              } while (lVar14 != 0xf0);
              local_290.m_data[0] =
                   (float)(~-(uint)((float)local_288._0_4_ < 0.0) & local_268._0_4_);
              lVar14 = 0;
              ppCVar11 = ppCVar1;
              do {
                pCVar3 = *ppCVar11;
                *(void **)((long)(&faces[0].m_pitch + 1) + lVar14 * 8) = pCVar3[iVar9].m_data;
                TVar4 = pCVar3[iVar9].m_format;
                uVar5 = *(undefined8 *)pCVar3[iVar9].m_size.m_data;
                piVar2 = pCVar3[iVar9].m_size.m_data + 2;
                uVar6 = *(undefined8 *)(piVar2 + 2);
                *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + -1) = *(undefined8 *)piVar2;
                *(undefined8 *)(faces[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar6;
                *(TextureFormat *)(faces[0].m_size.m_data + lVar14 * 2 + -2) = TVar4;
                *(undefined8 *)(faces[0].m_size.m_data + lVar14 * 2) = uVar5;
                lVar14 = lVar14 + 5;
                ppCVar11 = ppCVar11 + 1;
              } while (lVar14 != 0x1e);
              iVar15 = iVar9 + 1;
              lVar14 = 0;
              ppCVar11 = ppCVar1;
              do {
                pCVar3 = *ppCVar11;
                *(void **)((long)(&faces1[0].m_pitch + 1) + lVar14 * 8) = pCVar3[iVar15].m_data;
                TVar4 = pCVar3[iVar15].m_format;
                uVar5 = *(undefined8 *)pCVar3[iVar15].m_size.m_data;
                piVar2 = pCVar3[iVar15].m_size.m_data + 2;
                uVar6 = *(undefined8 *)(piVar2 + 2);
                *(undefined8 *)(faces1[0].m_pitch.m_data + lVar14 * 2 + -1) = *(undefined8 *)piVar2;
                *(undefined8 *)(faces1[0].m_pitch.m_data + lVar14 * 2 + 1) = uVar6;
                *(TextureFormat *)(faces1[0].m_size.m_data + lVar14 * 2 + -2) = TVar4;
                *(undefined8 *)(faces1[0].m_size.m_data + lVar14 * 2) = uVar5;
                lVar14 = lVar14 + 5;
                ppCVar11 = ppCVar11 + 1;
              } while (lVar14 != 0x1e);
              uVar10 = sampler->minFilter - LINEAR;
              FVar13 = NEAREST;
              if (uVar10 < 5) {
                FVar13 = *(FilterMode *)(&DAT_01d17018 + (ulong)uVar10 * 4);
              }
              local_290.m_data[1] =
                   (float)(~-(uint)((float)local_248._0_4_ < 0.0) & local_258._0_4_);
              bVar7 = isCubeMipmapLinearSampleResultValid
                                (&faces,&faces1,sampler,FVar13,local_2c0,&faceCoords,&local_290,
                                 result);
            } while (!bVar7);
            bVar7 = true;
LAB_019fdabc:
            if (iVar16 < iVar9) goto LAB_019fdac6;
          }
          if (bVar7) {
            return bVar12;
          }
        }
        local_270 = local_270 + 1;
        bVar12 = local_270 < numPossibleFaces;
      } while (local_270 < numPossibleFaces);
    }
  }
  return bVar12;
}

Assistant:

bool isLookupResultValid (const TextureCubeView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(coord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
	{
		const CubeFaceFloatCoords	faceCoords		(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], coord));
		const float					minLod			= lodBounds.x();
		const float					maxLod			= lodBounds.y();
		const bool					canBeMagnified	= minLod <= sampler.lodThreshold;
		const bool					canBeMinified	= maxLod > sampler.lodThreshold;

		if (canBeMagnified)
		{
			ConstPixelBufferAccess faces[CUBEFACE_LAST];
			getCubeLevelFaces(texture, 0, faces);

			if (isCubeLevelSampleResultValid(faces, sampler, sampler.magFilter, prec, faceCoords, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int	minLevel	= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
				{
					const float				minF	= de::clamp(minLod - float(levelNdx), 0.0f, 1.0f);
					const float				maxF	= de::clamp(maxLod - float(levelNdx), 0.0f, 1.0f);

					ConstPixelBufferAccess	faces0[CUBEFACE_LAST];
					ConstPixelBufferAccess	faces1[CUBEFACE_LAST];

					getCubeLevelFaces(texture, levelNdx,		faces0);
					getCubeLevelFaces(texture, levelNdx + 1,	faces1);

					if (isCubeMipmapLinearSampleResultValid(faces0, faces1, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int	minLevel	= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
				{
					ConstPixelBufferAccess faces[CUBEFACE_LAST];
					getCubeLevelFaces(texture, levelNdx, faces);

					if (isCubeLevelSampleResultValid(faces, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, result))
						return true;
				}
			}
			else
			{
				ConstPixelBufferAccess faces[CUBEFACE_LAST];
				getCubeLevelFaces(texture, 0, faces);

				if (isCubeLevelSampleResultValid(faces, sampler, sampler.minFilter, prec, faceCoords, result))
					return true;
			}
		}
	}

	return false;
}